

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void JX9_FILE_Const(jx9_value *pVal,void *pUserData)

{
  undefined8 *puVar1;
  SyString *pFile;
  jx9_vm *pVm;
  void *pUserData_local;
  jx9_value *pVal_local;
  
  puVar1 = (undefined8 *)SySetPeek((SySet *)((long)pUserData + 0x3e0));
  if (puVar1 == (undefined8 *)0x0) {
    jx9_value_string(pVal,":MEMORY:",8);
  }
  else {
    jx9_value_string(pVal,(char *)*puVar1,*(int *)(puVar1 + 1));
  }
  return;
}

Assistant:

static void JX9_FILE_Const(jx9_value *pVal, void *pUserData)
{
	jx9_vm *pVm = (jx9_vm *)pUserData;
	SyString *pFile;
	/* Peek the top entry */
	pFile = (SyString *)SySetPeek(&pVm->aFiles);
	if( pFile == 0 ){
		/* Expand the magic word: ":MEMORY:" */
		jx9_value_string(pVal, ":MEMORY:", (int)sizeof(":MEMORY:")-1);
	}else{
		jx9_value_string(pVal, pFile->zString, pFile->nByte);
	}
}